

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O1

Node * __thiscall
TMap<int,_FUDMFKeys,_THashTraits<int>,_TValueTraits<FUDMFKeys>_>::NewKey
          (TMap<int,_FUDMFKeys,_THashTraits<int>,_TValueTraits<FUDMFKeys>_> *this,int key)

{
  Node *pNVar1;
  undefined7 uVar2;
  int iVar3;
  undefined4 uVar4;
  Node *pNVar5;
  uint uVar6;
  Node *pNVar7;
  uint uVar8;
  Node *pNVar9;
  Node *pNVar10;
  Node *pNVar11;
  
  pNVar5 = this->Nodes;
  uVar6 = this->Size - 1;
  uVar8 = uVar6 & key;
  pNVar11 = pNVar5 + uVar8;
  pNVar7 = pNVar11->Next;
  if (pNVar7 == (Node *)0x1) {
    pNVar11->Next = (Node *)0x0;
  }
  else {
    pNVar1 = this->LastFree;
    do {
      pNVar9 = pNVar1 + -1;
      pNVar10 = (Node *)0x0;
      if (pNVar1 <= pNVar5) break;
      pNVar10 = pNVar9;
      pNVar1 = pNVar9;
    } while (pNVar9->Next != (Node *)0x1);
    this->LastFree = pNVar9;
    if (pNVar10 == (Node *)0x0) {
      Resize(this,this->Size * 2);
      pNVar5 = NewKey(this,key);
    }
    else {
      uVar6 = uVar6 & (pNVar11->Pair).Key;
      if (uVar6 == uVar8) {
        pNVar10->Next = pNVar7;
        pNVar5 = pNVar10;
        pNVar7 = pNVar10;
      }
      else {
        pNVar5 = pNVar5 + uVar6;
        do {
          pNVar7 = pNVar5;
          pNVar5 = pNVar7->Next;
        } while (pNVar5 != pNVar11);
        pNVar7->Next = pNVar10;
        uVar2 = *(undefined7 *)&(pNVar11->Pair).Value.field_0x11;
        (pNVar10->Pair).Value.mSorted = (pNVar11->Pair).Value.mSorted;
        *(undefined7 *)&(pNVar10->Pair).Value.field_0x11 = uVar2;
        pNVar5 = pNVar11->Next;
        iVar3 = (pNVar11->Pair).Key;
        uVar4 = *(undefined4 *)&(pNVar11->Pair).field_0x4;
        uVar6 = (pNVar11->Pair).Value.super_TArray<FUDMFKey,_FUDMFKey>.Most;
        uVar8 = (pNVar11->Pair).Value.super_TArray<FUDMFKey,_FUDMFKey>.Count;
        (pNVar10->Pair).Value.super_TArray<FUDMFKey,_FUDMFKey>.Array =
             (pNVar11->Pair).Value.super_TArray<FUDMFKey,_FUDMFKey>.Array;
        (pNVar10->Pair).Value.super_TArray<FUDMFKey,_FUDMFKey>.Most = uVar6;
        (pNVar10->Pair).Value.super_TArray<FUDMFKey,_FUDMFKey>.Count = uVar8;
        pNVar10->Next = pNVar5;
        (pNVar10->Pair).Key = iVar3;
        *(undefined4 *)&(pNVar10->Pair).field_0x4 = uVar4;
        pNVar5 = (Node *)0x0;
        pNVar7 = pNVar11;
      }
      pNVar11->Next = pNVar5;
      pNVar11 = pNVar7;
    }
    if (pNVar10 == (Node *)0x0) {
      return pNVar5;
    }
  }
  this->NumUsed = this->NumUsed + 1;
  (pNVar11->Pair).Key = key;
  return pNVar11;
}

Assistant:

Node *NewKey(const KT key)
	{
		Node *mp = MainPosition(key);
		if (!mp->IsNil())
		{
			Node *othern;
			Node *n = GetFreePos();		/* get a free place */
			if (n == NULL)				/* cannot find a free place? */
			{
				Rehash();				/* grow table */
				return NewKey(key);		/* re-insert key into grown table */
			}
			othern = MainPosition(mp->Pair.Key);
			if (othern != mp)			/* is colliding node out of its main position? */
			{	/* yes; move colliding node into free position */
				while (othern->Next != mp)	/* find previous */
				{
					othern = othern->Next;
				}
				othern->Next = n;		/* redo the chain with 'n' in place of 'mp' */
				CopyNode(n, mp); /* copy colliding node into free pos. (mp->Next also goes) */
				mp->Next = NULL;		/* now 'mp' is free */
			}
			else						/* colliding node is in its own main position */
			{							/* new node will go into free position */
				n->Next = mp->Next;		/* chain new position */
				mp->Next = n;
				mp = n;
			}
		}
		else
		{
			mp->Next = NULL;
		}
		++NumUsed;
		::new(&mp->Pair.Key) KT(key);
		return mp;
	}